

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PMurHash.c
# Opt level: O2

void PMurHash32_Process(uint32_t *ph1,uint32_t *pcarry,void *key,int len)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  uint32_t uVar6;
  void *pvVar7;
  uint uVar8;
  
  uVar6 = *ph1;
  uVar8 = *pcarry;
  uVar4 = uVar8 & 3;
  uVar2 = -(int)key & 3;
  iVar5 = len - uVar2;
  if (len < (int)uVar2 || uVar2 == 0) {
LAB_0011fb63:
    (*(code *)(&DAT_001258e0 + *(int *)(&DAT_001258e0 + (ulong)uVar4 * 4)))
              (ph1,pcarry,&DAT_001258e0 + *(int *)(&DAT_001258e0 + (ulong)uVar4 * 4),
               (long)(len / 4 << 2) + (long)key,len,uVar6);
    return;
  }
  pvVar7 = (void *)((ulong)(-(int)key & 3) + (long)key);
  do {
    lVar3 = 0;
    do {
      if (uVar2 == (uint)lVar3) {
        uVar4 = uVar4 + (uint)lVar3;
        key = pvVar7;
        len = iVar5;
        goto LAB_0011fb63;
      }
      uVar1 = uVar8 >> 8;
      uVar8 = uVar1 | (uint)*(byte *)((long)key + lVar3) << 0x18;
      lVar3 = lVar3 + 1;
    } while ((int)lVar3 + uVar4 != 4);
    uVar8 = (uVar8 * -0x3361d2af >> 0x11 | uVar1 * 0x16a88000) * 0x1b873593;
    uVar6 = ((uVar6 ^ uVar8) << 0xd | (uVar6 ^ uVar8) >> 0x13) * 5 + 0xe6546b64;
    uVar2 = uVar2 - (int)lVar3;
    key = (void *)((long)key + lVar3);
    uVar4 = 0;
  } while( true );
}

Assistant:

void PMurHash32_Process(uint32_t *ph1, uint32_t *pcarry, const void *key, int len)
{
  uint32_t h1 = *ph1;
  uint32_t c = *pcarry;

  const uint8_t *ptr = (uint8_t*)key;
  const uint8_t *end;

  /* Extract carry count from low 2 bits of c value */
  int n = c & 3;

#if defined(UNALIGNED_SAFE)
  /* This CPU handles unaligned word access */

  /* Consume any carry bytes */
  int i = (4-n) & 3;
  if(i && i <= len) {
    DOBYTES(i, h1, c, n, ptr, len);
  }

  /* Process 32-bit chunks */
  end = ptr + len/4*4;
  for( ; ptr < end ; ptr+=4) {
    uint32_t k1 = READ_UINT32(ptr);
    DOBLOCK(h1, k1);
  }

#else /*UNALIGNED_SAFE*/
  /* This CPU does not handle unaligned word access */

  /* Consume enough so that the next data byte is word aligned */
  int i = -(long)ptr & 3;
  if(i && i <= len) {
      DOBYTES(i, h1, c, n, ptr, len);
  }

  /* We're now aligned. Process in aligned blocks. Specialise for each possible carry count */
  end = ptr + len/4*4;
  switch(n) { /* how many bytes in c */
  case 0: /* c=[----]  w=[3210]  b=[3210]=w            c'=[----] */
    for( ; ptr < end ; ptr+=4) {
      uint32_t k1 = READ_UINT32(ptr);
      DOBLOCK(h1, k1);
    }
    break;
  case 1: /* c=[0---]  w=[4321]  b=[3210]=c>>24|w<<8   c'=[4---] */
    for( ; ptr < end ; ptr+=4) {
      uint32_t k1 = c>>24;
      c = READ_UINT32(ptr);
      k1 |= c<<8;
      DOBLOCK(h1, k1);
    }
    break;
  case 2: /* c=[10--]  w=[5432]  b=[3210]=c>>16|w<<16  c'=[54--] */
    for( ; ptr < end ; ptr+=4) {
      uint32_t k1 = c>>16;
      c = READ_UINT32(ptr);
      k1 |= c<<16;
      DOBLOCK(h1, k1);
    }
    break;
  case 3: /* c=[210-]  w=[6543]  b=[3210]=c>>8|w<<24   c'=[654-] */
    for( ; ptr < end ; ptr+=4) {
      uint32_t k1 = c>>8;
      c = READ_UINT32(ptr);
      k1 |= c<<24;
      DOBLOCK(h1, k1);
    }
  }
#endif /*UNALIGNED_SAFE*/

  /* Advance over whole 32-bit chunks, possibly leaving 1..3 bytes */
  len -= len/4*4;

  /* Append any remaining bytes into carry */
  DOBYTES(len, h1, c, n, ptr, len);

  /* Copy out new running hash and carry */
  *ph1 = h1;
  *pcarry = (c & ~0xff) | n;
}